

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeLoadConstantLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  Type *pTVar1;
  mapped_type *this_00;
  uint64_t uVar2;
  undefined1 *from;
  LoadConstantLayerParams load_constant;
  
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_00,pTVar1);
  if (specLayer->_oneof_case_[0] == 0x122) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_LoadConstantLayerParams_default_instance_;
  }
  Specification::LoadConstantLayerParams::LoadConstantLayerParams
            (&load_constant,(LoadConstantLayerParams *)from);
  ShapeConstraint::setSequence(this_00,1);
  ShapeConstraint::setBatch(this_00,1);
  uVar2 = Specification::LoadConstantLayerParams::_internal_shape(&load_constant,0);
  ShapeConstraint::setChannel(this_00,uVar2);
  uVar2 = Specification::LoadConstantLayerParams::_internal_shape(&load_constant,1);
  ShapeConstraint::setHeight(this_00,uVar2);
  uVar2 = Specification::LoadConstantLayerParams::_internal_shape(&load_constant,2);
  ShapeConstraint::setWidth(this_00,uVar2);
  Specification::LoadConstantLayerParams::~LoadConstantLayerParams(&load_constant);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeLoadConstantLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    Specification::LoadConstantLayerParams load_constant = specLayer.loadconstant();

    outputShape.setSequence(1);
    outputShape.setBatch(1);
    outputShape.setChannel((size_t)load_constant.shape(0));
    outputShape.setHeight((size_t)load_constant.shape(1));
    outputShape.setWidth((size_t)load_constant.shape(2));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}